

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O1

void __thiscall QLoggingRegistry::setApiRules(QLoggingRegistry *this,QString *content)

{
  __pointer_type copy;
  qsizetype qVar1;
  Data *pDVar2;
  QLoggingRule *pQVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QStringView content_00;
  QArrayDataPointer<QLoggingRule> local_80;
  QMessageLogger local_68;
  QLoggingSettingsParser local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._rules.d.d = (Data *)0x0;
  local_48._rules.d.ptr = (QLoggingRule *)0x0;
  local_48._rules.d.size = 0;
  local_48.m_inRulesSection = true;
  local_48._1_7_ = 0xaaaaaaaaaaaaaa;
  content_00.m_data = (content->d).ptr;
  content_00.m_size = (content->d).size;
  QLoggingSettingsParser::setContent(&local_48,content_00);
  bVar4 = qtLoggingDebug();
  if (bVar4) {
    local_68.context.version = 2;
    local_68.context.line = 0;
    local_68.context.file._0_4_ = 0;
    local_68.context.file._4_4_ = 0;
    local_68.context.function._0_4_ = 0;
    local_68.context.function._4_4_ = 0;
    local_68.context.category = "qt.core.logging";
    QMessageLogger::debug
              (&local_68,"Loading logging rules set by QLoggingCategory::setFilterRules ...");
  }
  if ((this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar4 = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar4) {
      (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar4) goto LAB_0024d309;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this);
LAB_0024d309:
  if (local_48._rules.d.d != (Data *)0x0) {
    LOCK();
    ((local_48._rules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48._rules.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_80.d = (Data *)0x0;
  local_80.ptr = (QLoggingRule *)0x0;
  local_80.size = 0;
  pDVar2 = this->ruleSets[2].d.d;
  pQVar3 = this->ruleSets[2].d.ptr;
  this->ruleSets[2].d.d = local_48._rules.d.d;
  this->ruleSets[2].d.ptr = local_48._rules.d.ptr;
  local_68.context.version = (int)pDVar2;
  local_68.context.line = (int)((ulong)pDVar2 >> 0x20);
  local_68.context.file._0_4_ = SUB84(pQVar3,0);
  local_68.context.file._4_4_ = (undefined4)((ulong)pQVar3 >> 0x20);
  qVar1 = this->ruleSets[2].d.size;
  this->ruleSets[2].d.size = local_48._rules.d.size;
  local_68.context.function._0_4_ = (undefined4)qVar1;
  local_68.context.function._4_4_ = (undefined4)((ulong)qVar1 >> 0x20);
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer((QArrayDataPointer<QLoggingRule> *)&local_68);
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_80);
  updateRules(this);
  LOCK();
  copy = (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->registryMutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
  }
  QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_48._rules.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLoggingRegistry::setApiRules(const QString &content)
{
    QLoggingSettingsParser parser;
    parser.setImplicitRulesSection(true);
    parser.setContent(content);

    if (qtLoggingDebug())
        debugMsg("Loading logging rules set by QLoggingCategory::setFilterRules ...");

    const QMutexLocker locker(&registryMutex);

    ruleSets[ApiRules] = parser.rules();

    updateRules();
}